

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

uint8_t * SSL_get0_session_id_context(SSL *ssl,size_t *out_len)

{
  bool bVar1;
  pointer pSVar2;
  pointer pCVar3;
  size_t sVar4;
  size_t *out_len_local;
  SSL *ssl_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (bVar1) {
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    pCVar3 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&pSVar2->cert);
    sVar4 = bssl::InplaceVector<unsigned_char,_32UL>::size(&pCVar3->sid_ctx);
    *out_len = sVar4;
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
    pCVar3 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&pSVar2->cert);
    ssl_local = (SSL *)bssl::InplaceVector<unsigned_char,_32UL>::data(&pCVar3->sid_ctx);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
    if (!bVar1) {
      __assert_fail("ssl->config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x595,"const uint8_t *SSL_get0_session_id_context(const SSL *, size_t *)");
    }
    *out_len = 0;
    ssl_local = (SSL *)0x0;
  }
  return (uint8_t *)ssl_local;
}

Assistant:

const uint8_t *SSL_get0_session_id_context(const SSL *ssl, size_t *out_len) {
  if (!ssl->config) {
    assert(ssl->config);
    *out_len = 0;
    return NULL;
  }
  *out_len = ssl->config->cert->sid_ctx.size();
  return ssl->config->cert->sid_ctx.data();
}